

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<int,int,int,duckdb::BothInclusiveBetweenOperator,false,true,false>
                (int *adata,int *bdata,int *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  idx_t row_idx;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  idx_t row_idx_00;
  idx_t iVar5;
  idx_t row_idx_01;
  
  iVar4 = 0;
  iVar3 = 0;
  do {
    if (count == iVar4) {
      return iVar3;
    }
    iVar5 = iVar4;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)result_sel->sel_vector[iVar4];
    }
    row_idx_01 = iVar4;
    if (asel->sel_vector != (sel_t *)0x0) {
      row_idx_01 = (idx_t)asel->sel_vector[iVar4];
    }
    row_idx_00 = iVar4;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (idx_t)bsel->sel_vector[iVar4];
    }
    row_idx = iVar4;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)csel->sel_vector[iVar4];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (!bVar1) goto LAB_017f17b5;
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (!bVar1) goto LAB_017f17b5;
      uVar2 = (ulong)(adata[row_idx_01] <= cdata[row_idx] && bdata[row_idx_00] <= adata[row_idx_01])
      ;
    }
    else {
LAB_017f17b5:
      uVar2 = 0;
    }
    true_sel->sel_vector[iVar3] = (sel_t)iVar5;
    iVar3 = iVar3 + uVar2;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}